

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1162::run(TestCase1162 *this)

{
  int iVar1;
  AsyncIoProvider *pAVar2;
  undefined4 extraout_var;
  MonotonicClock *pMVar3;
  undefined4 extraout_var_00;
  NetworkAddress *pNVar4;
  void *pvVar5;
  long *in_R8;
  SourceLocation local_170;
  undefined1 local_158 [8];
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> local_150;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_148;
  Type local_138;
  undefined1 local_130 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
  _kjDefer1175;
  Fault f_1;
  SyscallResult _kjSyscallResult_1;
  Fault f;
  SyscallResult local_fc;
  undefined1 local_f8 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  OwnFd originalDirFd;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  SourceLocation local_d8;
  StringPtr local_c0;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_b0;
  undefined1 local_a8 [8];
  Own<kj::NetworkAddress,_std::nullptr_t> addr;
  char local_8c [4];
  undefined1 local_88 [8];
  String address;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_68;
  Quantity<long,kj::_::NanosecondLabel> local_60 [8];
  Quantity<long,_kj::_::NanosecondLabel> elapsedSinceEpoch;
  Network *network;
  AsyncIoContext ioContext;
  TestCase1162 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar2 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  iVar1 = (*pAVar2->_vptr_AsyncIoProvider[3])();
  pMVar3 = systemPreciseMonotonicClock();
  local_68.value.value._0_4_ = (**pMVar3->_vptr_MonotonicClock)();
  local_68.value.value._4_4_ = extraout_var_00;
  address.content.disposer =
       (ArrayDisposer *)
       origin<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>();
  local_60 = (Quantity<long,kj::_::NanosecondLabel>  [8])
             Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                       (&local_68,
                        (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                        &address.content.disposer);
  local_8c = (char  [4])getpid();
  addr.ptr = (NetworkAddress *)
             Quantity<long,kj::_::NanosecondLabel>::operator/
                       (local_60,(Quantity<long,_kj::_::NanosecondLabel> *)&NANOSECONDS);
  str<char_const(&)[18],int,long>
            ((String *)local_88,(kj *)"unix-abstract:foo",(char (*) [18])local_8c,(int *)&addr.ptr,
             in_R8);
  StringPtr::StringPtr(&local_c0,(String *)local_88);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&local_b0,(undefined8 *)CONCAT44(extraout_var,iVar1),local_c0.content.ptr,
             local_c0.content.size_,0);
  SourceLocation::SourceLocation
            (&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x490,0x1e);
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)local_a8,&local_b0);
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(&local_b0);
  pNVar4 = Own<kj::NetworkAddress,_std::nullptr_t>::operator->
                     ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_a8);
  (*pNVar4->_vptr_NetworkAddress[2])(&_kj_fd);
  f.exception = (Exception *)local_f8;
  local_fc = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase1162::run()::__0>
                       ((anon_class_8_1_4955c7dd *)&f,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_fc);
  if (pvVar5 == (void *)0x0) {
    iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_fc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffef0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x495,iVar1,"_kj_fd = open(\".\", 00 | 0200000 | 02000000)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffef0);
  }
  OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_f8);
  f_1.exception._4_4_ =
       kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase1162::run()::__1>
                 ((anon_class_1_0_00000001 *)((long)&f_1.exception + 3),false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_
                     ((SyscallResult *)((long)&f_1.exception + 4));
  if (pvVar5 != (void *)0x0) {
    local_138.originalDirFd = (OwnFd *)&_kjSyscallResult;
    defer<kj::(anonymous_namespace)::TestCase1162::run()::__2>((kj *)local_130,&local_138);
    pNVar4 = Own<kj::NetworkAddress,_std::nullptr_t>::operator->
                       ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_a8);
    (**pNVar4->_vptr_NetworkAddress)(local_158);
    mv<kj::Own<kj::ConnectionReceiver,decltype(nullptr)>>
              ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&_kj_fd);
    Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
    attach<kj::Own<kj::ConnectionReceiver,decltype(nullptr)>>
              ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)&local_150,
               (Own<kj::ConnectionReceiver,_std::nullptr_t> *)local_158);
    SourceLocation::SourceLocation
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,"run",0x499,3);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
              ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_148,&local_150);
    Own<kj::AsyncIoStream,_std::nullptr_t>::~Own(&local_148);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(&local_150);
    Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
              ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)local_158);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:1175:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
                 *)local_130);
    OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
    Own<kj::ConnectionReceiver,_std::nullptr_t>::~Own
              ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&_kj_fd);
    Own<kj::NetworkAddress,_std::nullptr_t>::~Own
              ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_a8);
    String::~String((String *)local_88);
    AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&network);
    return;
  }
  iVar1 = kj::_::Debug::SyscallResult::getErrorNumber((SyscallResult *)((long)&f_1.exception + 4));
  kj::_::Debug::Fault::Fault
            ((Fault *)&_kjDefer1175.maybeFunc.ptr.field_1.value,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,0x496,iVar1,"chdir(\"/\")","");
  kj::_::Debug::Fault::fatal((Fault *)&_kjDefer1175.maybeFunc.ptr.field_1.value);
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();
  auto elapsedSinceEpoch = systemPreciseMonotonicClock().now() - kj::origin<TimePoint>();
  auto address = kj::str("unix-abstract:foo", getpid(), elapsedSinceEpoch / kj::NANOSECONDS);

  Own<NetworkAddress> addr = network.parseAddress(address).wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  auto originalDirFd = KJ_SYSCALL_FD(open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}